

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O3

ssize_t __thiscall
libtorrent::aux::part_file::read(part_file *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  __node_base_ptr p_Var2;
  int iVar3;
  undefined4 in_register_00000034;
  int in_R8D;
  error_code *in_R9;
  error_code *ec;
  span<char> buf;
  file_handle f;
  unique_lock<std::mutex> l;
  undefined1 local_5c [40];
  key_type local_34;
  
  local_5c._8_4_ = in_register_00000034;
  local_5c._4_4_ = __fd;
  iVar3 = (int)__nbytes;
  local_5c._20_8_ = &this->m_mutex;
  local_5c[0x1c] = '\0';
  ec = in_R9;
  local_5c._12_8_ = __buf;
  local_34.m_val = iVar3;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_5c + 0x14));
  local_5c[0x1c] = '\x01';
  p_Var2 = ::std::
           _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_piece_map)._M_h,
                      (ulong)(long)iVar3 % (this->m_piece_map)._M_h._M_bucket_count,&local_34,
                      (long)iVar3);
  if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
    in_R9->val_ = 2;
    in_R9->failed_ = true;
    *(undefined3 *)&in_R9->field_0x5 = 0;
    in_R9->cat_ = &boost::system::detail::cat_holder<void>::generic_category_instance.
                   super_error_category;
    uVar1 = 0xffffffff;
  }
  else {
    iVar3 = *(int *)((long)&p_Var2->_M_nxt[1]._M_nxt + 4);
    ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)(local_5c + 0x14));
    open_file((part_file *)local_5c,(open_mode_t)(uint)this,(error_code *)0x20);
    uVar1 = 0xffffffff;
    if (in_R9->failed_ == false) {
      buf.m_len = (long)in_R8D + (long)this->m_header_size + (long)this->m_piece_size * (long)iVar3;
      buf.m_ptr = (char *)local_5c._12_8_;
      uVar1 = pread_all((aux *)(ulong)(uint)local_5c._0_4_,(handle_type)local_5c._4_8_,buf,
                        (int64_t)in_R9,ec);
    }
    file_handle::~file_handle((file_handle *)local_5c);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_5c + 0x14));
  return (ulong)uVar1;
}

Assistant:

int part_file::read(span<char> buf
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = make_error_code(boost::system::errc::no_such_file_or_directory);
			return -1;
		}

		slot_index_t const slot = i->second;
		l.unlock();

		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		return int(aux::pread_all(f.fd(), buf, slot_offset(slot) + offset, ec));
	}